

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

void GameLoop::startTournament(void)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  pointer *this_00;
  Map *map;
  int draw;
  int games;
  undefined4 numPlayers;
  bool bVar1;
  ostream *poVar2;
  reference ppMVar3;
  vector<Player_*,_std::allocator<Player_*>_> *pvVar4;
  Deck *this_01;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar5;
  size_type sVar6;
  GameLoop *pGVar7;
  vector<int,_std::allocator<int>_> local_1d8;
  vector<char,_std::allocator<char>_> local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  int local_18c;
  Deck *local_188;
  Deck *gameDeck;
  vector<Player_*,_std::allocator<Player_*>_> *local_168;
  vector<Player_*,_std::allocator<Player_*>_> *gamePlayers;
  Map *pMStack_158;
  int i;
  Map *currentMap;
  iterator __end1;
  iterator __begin1;
  vector<Map_*,_std::allocator<Map_*>_> *__range1;
  vector<int,_std::allocator<int>_> winners;
  int maxTurns;
  int numGamesToPlay;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_100;
  AlternativeLoader local_f8;
  AlternativeLoader altLoader;
  undefined1 local_d0 [8];
  MapLoader myLoader;
  string local_b8 [48];
  Map *local_88;
  Map *gameMap;
  string mapToLoad;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mapNames;
  vector<Map_*,_std::allocator<Map_*>_> mapList;
  undefined1 local_28 [4];
  int numMaps;
  vector<char,_std::allocator<char>_> playerStrats;
  int numberOfPlayers;
  
  std::operator<<((ostream *)&std::cout,
                  "____    __    ____  _______  __        ______   ______   .___  ___.  _______    .___________.  ______      .______       __       _______. __  ___  __  \n\\   \\  /  \\  /   / |   ____||  |      /      | /  __  \\  |   \\/   | |   ____|   |           | /  __  \\     |   _  \\     |  |     /       ||  |/  / |  | \n \\   \\/    \\/   /  |  |__   |  |     |  ,----\'|  |  |  | |  \\  /  | |  |__      `---|  |----`|  |  |  |    |  |_)  |    |  |    |   (----`|  \'  /  |  | \n  \\            /   |   __|  |  |     |  |     |  |  |  | |  |\\/|  | |   __|         |  |     |  |  |  |    |      /     |  |     \\   \\    |    <   |  | \n   \\    /\\    /    |  |____ |  `----.|  `----.|  `--\'  | |  |  |  | |  |____        |  |     |  `--\'  |    |  |\\  \\----.|  | .----)   |   |  .  \\  |__| \n    \\__/  \\__/     |_______||_______| \\______| \\______/  |__|  |__| |_______|       |__|      \\______/     | _| `._____||__| |_______/    |__|\\__\\ (__) \n                                                                                                                                                        "
                 );
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  playerStrats.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
       choosePlayerNumber(2,4);
  choosePlayerStrats((vector<char,_std::allocator<char>_> *)local_28,
                     playerStrats.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_);
  mapList.super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<Map_*,_std::allocator<Map_*>_>::vector
            ((vector<Map_*,_std::allocator<Map_*>_> *)
             &mapNames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&mapToLoad.field_2 + 8));
  do {
    std::__cxx11::string::string((string *)&gameMap);
    if ((mapList.super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ == 0) || (bVar1 = loadOtherMap(), bVar1)) {
      chooseMap_abi_cxx11_();
      std::__cxx11::string::operator=((string *)&gameMap,local_b8);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::string((string *)&altLoader,(string *)&gameMap);
      MapLoader::MapLoader((MapLoader *)local_d0,(string *)&altLoader);
      std::__cxx11::string::~string((string *)&altLoader);
      local_88 = MapLoader::readMapFile((MapLoader *)local_d0);
      if (local_88 == (Map *)0x0) {
        AlternativeLoader::AlternativeLoader(&local_f8,(string *)&gameMap);
        local_88 = AlternativeLoader::altReadMapFile(&local_f8);
        AlternativeLoader::~AlternativeLoader(&local_f8);
      }
      if ((local_88 == (Map *)0x0) || (bVar1 = Map::testConnected(local_88), !bVar1)) {
        std::operator<<((ostream *)&std::cout,
                        "\nThere was an error loading the game board. Try another mapfile.\n");
        myLoader.pMapFile._4_4_ = 3;
      }
      else {
        pvVar5 = Map::getMapCountries(local_88);
        sVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar5);
        if ((int)sVar6 <
            (int)playerStrats.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_) {
          poVar2 = std::operator<<((ostream *)&std::cout,"The selected map with ");
          pvVar5 = Map::getMapCountries(local_88);
          sVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar5);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar6);
          poVar2 = std::operator<<(poVar2," cannot support ");
          poVar2 = (ostream *)
                   std::ostream::operator<<
                             (poVar2,playerStrats.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl._20_4_);
          poVar2 = std::operator<<(poVar2," players. Please try again.");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          myLoader.pMapFile._4_4_ = 3;
        }
        else {
          this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&mapToLoad.field_2 + 8);
          local_108._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this);
          local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::end(this);
          local_100 = std::
                      find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                                (local_108,
                                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_110,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&gameMap);
          _maxTurns = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&mapToLoad.field_2 + 8));
          bVar1 = __gnu_cxx::operator!=
                            (&local_100,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&maxTurns);
          if (bVar1) {
            std::operator<<((ostream *)&std::cout,
                            "\nThis map was already chosen, choose another map file.\n");
            myLoader.pMapFile._4_4_ = 3;
          }
          else {
            mapList.super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ =
                 mapList.super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
            std::vector<Map_*,_std::allocator<Map_*>_>::push_back
                      ((vector<Map_*,_std::allocator<Map_*>_> *)
                       &mapNames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_88);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&mapToLoad.field_2 + 8),(value_type *)&gameMap);
            if (mapList.super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ < 5) {
              myLoader.pMapFile._4_4_ = 0;
            }
            else {
              std::operator<<((ostream *)&std::cout,"\nThe maximum number of maps was created.\n");
              myLoader.pMapFile._4_4_ = 2;
            }
          }
        }
      }
      MapLoader::~MapLoader((MapLoader *)local_d0);
    }
    else {
      myLoader.pMapFile._4_4_ = 2;
    }
    std::__cxx11::string::~string((string *)&gameMap);
  } while ((myLoader.pMapFile._4_4_ == 0) || (myLoader.pMapFile._4_4_ != 2));
  winners.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = chooseNumGamesToPlay();
  winners.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = chooseMaxTurns();
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&__range1);
  this_00 = &mapNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end1 = std::vector<Map_*,_std::allocator<Map_*>_>::begin
                     ((vector<Map_*,_std::allocator<Map_*>_> *)this_00);
  currentMap = (Map *)std::vector<Map_*,_std::allocator<Map_*>_>::end
                                ((vector<Map_*,_std::allocator<Map_*>_> *)this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Map_**,_std::vector<Map_*,_std::allocator<Map_*>_>_>
                                     *)&currentMap), bVar1) {
    ppMVar3 = __gnu_cxx::__normal_iterator<Map_**,_std::vector<Map_*,_std::allocator<Map_*>_>_>::
              operator*(&__end1);
    pMStack_158 = *ppMVar3;
    for (gamePlayers._4_4_ = 0;
        numPlayers = playerStrats.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_,
        map = pMStack_158,
        gamePlayers._4_4_ <
        winners.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_; gamePlayers._4_4_ = gamePlayers._4_4_ + 1) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&gameDeck,
                 (vector<char,_std::allocator<char>_> *)local_28);
      pvVar4 = initPlayers(numPlayers,map,(vector<char,_std::allocator<char>_> *)&gameDeck);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)&gameDeck);
      local_168 = pvVar4;
      this_01 = (Deck *)operator_new(0x18);
      pvVar5 = Map::getMapCountries(pMStack_158);
      sVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar5);
      Deck::Deck(this_01,(int)sVar6);
      local_188 = this_01;
      Deck::createDeck(this_01);
      initInstance(pMStack_158,local_168,local_188);
      pGVar7 = getInstance();
      distributeArmies(pGVar7);
      pGVar7 = getInstance();
      local_18c = loop(pGVar7,(int)winners.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&__range1,&local_18c);
      resetInstance();
    }
    __gnu_cxx::__normal_iterator<Map_**,_std::vector<Map_*,_std::allocator<Map_*>_>_>::operator++
              (&__end1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1a8,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&mapToLoad.field_2 + 8));
  std::vector<char,_std::allocator<char>_>::vector
            (&local_1c0,(vector<char,_std::allocator<char>_> *)local_28);
  games = winners.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  draw = (int)winners.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_1d8,(vector<int,_std::allocator<int>_> *)&__range1);
  printGameReport(&local_1a8,&local_1c0,games,draw,&local_1d8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_1d8);
  std::vector<char,_std::allocator<char>_>::~vector(&local_1c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a8);
  std::operator<<((ostream *)&std::cout,
                  "\n.___________. __    __       ___      .__   __.  __  ___      _______.    _______   ______   .______         .______    __          ___   ____    ____  __  .__   __.   _______  __  \n|           ||  |  |  |     /   \\     |  \\ |  | |  |/  /     /       |   |   ____| /  __  \\  |   _  \\        |   _  \\  |  |        /   \\  \\   \\  /   / |  | |  \\ |  |  /  _____||  | \n`---|  |----`|  |__|  |    /  ^  \\    |   \\|  | |  \'  /     |   (----`   |  |__   |  |  |  | |  |_)  |       |  |_)  | |  |       /  ^  \\  \\   \\/   /  |  | |   \\|  | |  |  __  |  | \n    |  |     |   __   |   /  /_\\  \\   |  . `  | |    <       \\   \\       |   __|  |  |  |  | |      /        |   ___/  |  |      /  /_\\  \\  \\_    _/   |  | |  . `  | |  | |_ | |  | \n    |  |     |  |  |  |  /  _____  \\  |  |\\   | |  .  \\  .----)   |      |  |     |  `--\'  | |  |\\  \\----.   |  |      |  `----./  _____  \\   |  |     |  | |  |\\   | |  |__| | |__| \n    |__|     |__|  |__| /__/     \\__\\ |__| \\__| |__|\\__\\ |_______/       |__|      \\______/  | _| `._____|   | _|      |_______/__/     \\__\\  |__|     |__| |__| \\__|  \\______| (__) \n                                                                                                                                                                                     "
                 );
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&__range1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&mapToLoad.field_2 + 8));
  std::vector<Map_*,_std::allocator<Map_*>_>::~vector
            ((vector<Map_*,_std::allocator<Map_*>_> *)
             &mapNames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_28)
  ;
  return;
}

Assistant:

void GameLoop::startTournament() {

    std::cout
            << "____    __    ____  _______  __        ______   ______   .___  ___.  _______    .___________.  ______      .______       __       _______. __  ___  __  \n"
               "\\   \\  /  \\  /   / |   ____||  |      /      | /  __  \\  |   \\/   | |   ____|   |           | /  __  \\     |   _  \\     |  |     /       ||  |/  / |  | \n"
               " \\   \\/    \\/   /  |  |__   |  |     |  ,----'|  |  |  | |  \\  /  | |  |__      `---|  |----`|  |  |  |    |  |_)  |    |  |    |   (----`|  '  /  |  | \n"
               "  \\            /   |   __|  |  |     |  |     |  |  |  | |  |\\/|  | |   __|         |  |     |  |  |  |    |      /     |  |     \\   \\    |    <   |  | \n"
               "   \\    /\\    /    |  |____ |  `----.|  `----.|  `--'  | |  |  |  | |  |____        |  |     |  `--'  |    |  |\\  \\----.|  | .----)   |   |  .  \\  |__| \n"
               "    \\__/  \\__/     |_______||_______| \\______| \\______/  |__|  |__| |_______|       |__|      \\______/     | _| `._____||__| |_______/    |__|\\__\\ (__) \n"
               "                                                                                                                                                        ";
    std::cout << endl;
    int numberOfPlayers = choosePlayerNumber(2, 4);
    vector<char> playerStrats = choosePlayerStrats(numberOfPlayers);
    int numMaps = 0;
    vector<Map*> mapList;
    vector<string> mapNames;
    do {
        //which map to load
        std::string mapToLoad;
        Map* gameMap;
        if (numMaps == 0 || loadOtherMap()) {
            mapToLoad = chooseMap();
        } else {
            break;
        }
        //load the map (try to use both loaders, to accept both map types)
        MapLoader myLoader = MapLoader(mapToLoad);
        gameMap = myLoader.readMapFile();
        if (gameMap == nullptr) {
            AlternativeLoader altLoader = AlternativeLoader(mapToLoad);
            gameMap = altLoader.altReadMapFile();
        }
        //test map
        if (gameMap == nullptr || !gameMap->testConnected()) {
            cout << "\nThere was an error loading the game board. Try another mapfile.\n";
            continue;
        } else if (int(gameMap->getMapCountries()->size()) < numberOfPlayers) {
            std::cout << "The selected map with " << gameMap->getMapCountries()->size() << " cannot support "
                      << numberOfPlayers << " players. Please try again." << std::endl;
            continue;
        } else if (std::find(mapNames.begin(), mapNames.end(), mapToLoad) != mapNames.end()) {
            cout << "\nThis map was already chosen, choose another map file.\n";
            continue;
        } else {
            numMaps++;
            mapList.push_back(gameMap);
            mapNames.push_back(mapToLoad);
        }
        //bail
        if (numMaps >= 5) {
            cout << "\nThe maximum number of maps was created.\n";
            break;
        }
    } while (true);

    //fetch game settings
    int numGamesToPlay = chooseNumGamesToPlay();
    int maxTurns = chooseMaxTurns();

    //run the games
    vector<int> winners;
    for (auto currentMap : mapList) {
        for (int i = 0; i < numGamesToPlay; i++) {
            std::vector<Player*>* gamePlayers = initPlayers(numberOfPlayers, currentMap, playerStrats);
            Deck* gameDeck = new Deck(currentMap->getMapCountries()->size());
            gameDeck->createDeck();
            GameLoop::initInstance(currentMap, gamePlayers, gameDeck);

            GameLoop::getInstance()->distributeArmies();
            winners.push_back(GameLoop::getInstance()->loop(maxTurns));
            GameLoop::resetInstance();
        }
    }
    printGameReport(mapNames, playerStrats, numGamesToPlay, maxTurns, winners);
    std::cout << "\n"
                 ".___________. __    __       ___      .__   __.  __  ___      _______.    _______   ______   .______         .______    __          ___   ____    ____  __  .__   __.   _______  __  \n"
                 "|           ||  |  |  |     /   \\     |  \\ |  | |  |/  /     /       |   |   ____| /  __  \\  |   _  \\        |   _  \\  |  |        /   \\  \\   \\  /   / |  | |  \\ |  |  /  _____||  | \n"
                 "`---|  |----`|  |__|  |    /  ^  \\    |   \\|  | |  '  /     |   (----`   |  |__   |  |  |  | |  |_)  |       |  |_)  | |  |       /  ^  \\  \\   \\/   /  |  | |   \\|  | |  |  __  |  | \n"
                 "    |  |     |   __   |   /  /_\\  \\   |  . `  | |    <       \\   \\       |   __|  |  |  |  | |      /        |   ___/  |  |      /  /_\\  \\  \\_    _/   |  | |  . `  | |  | |_ | |  | \n"
                 "    |  |     |  |  |  |  /  _____  \\  |  |\\   | |  .  \\  .----)   |      |  |     |  `--'  | |  |\\  \\----.   |  |      |  `----./  _____  \\   |  |     |  | |  |\\   | |  |__| | |__| \n"
                 "    |__|     |__|  |__| /__/     \\__\\ |__| \\__| |__|\\__\\ |_______/       |__|      \\______/  | _| `._____|   | _|      |_______/__/     \\__\\  |__|     |__| |__| \\__|  \\______| (__) \n"
                 "                                                                                                                                                                                     ";
}